

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::DoMaxima(Clipper *this,TEdge *e,long64 topY)

{
  TEdge *pTVar1;
  clipperException *this_00;
  TEdge *e2;
  TEdge **ppTVar2;
  TEdge **ppTVar3;
  TEdge *pTVar4;
  TEdge *pTVar5;
  long lVar6;
  IntPoint local_40;
  
  e2 = e->next;
  if ((((e2 == (TEdge *)0x0) || (e2->ytop != e->ytop)) || (e2->nextInLML != (TEdge *)0x0)) ||
     (lVar6 = e2->xtop, lVar6 != e->xtop)) {
    lVar6 = e->xtop;
    e2 = e->prev;
  }
  pTVar5 = e->nextInAEL;
  if (pTVar5 != e2) {
    do {
      if (pTVar5 == (TEdge *)0x0) {
        this_00 = (clipperException *)__cxa_allocate_exception(0x28);
        clipperException::clipperException(this_00,"DoMaxima error");
        goto LAB_006e3fef;
      }
      local_40.X = lVar6;
      local_40.Y = topY;
      IntersectEdges(this,e,pTVar5,&local_40,ipBoth);
      pTVar5 = pTVar5->nextInAEL;
    } while (pTVar5 != e2);
  }
  if (e->outIdx < 0) {
    if (-1 < e2->outIdx) goto LAB_006e4005;
    pTVar5 = e->nextInAEL;
    pTVar1 = e->prevInAEL;
    pTVar4 = this->m_ActiveEdges;
    ppTVar3 = &this->m_ActiveEdges;
    if (pTVar4 == e || (pTVar1 != (TEdge *)0x0 || pTVar5 != (TEdge *)0x0)) {
      ppTVar2 = &pTVar1->nextInAEL;
      if (pTVar1 == (TEdge *)0x0) {
        ppTVar2 = ppTVar3;
      }
      *ppTVar2 = pTVar5;
      if (pTVar5 != (TEdge *)0x0) {
        pTVar5->prevInAEL = pTVar1;
      }
      e->nextInAEL = (TEdge *)0x0;
      e->prevInAEL = (TEdge *)0x0;
      pTVar4 = *ppTVar3;
    }
    pTVar5 = e2->nextInAEL;
    pTVar1 = e2->prevInAEL;
    if (((pTVar1 != (TEdge *)0x0) || (pTVar5 != (TEdge *)0x0)) || (pTVar4 == e2)) {
      if (pTVar1 != (TEdge *)0x0) {
        ppTVar3 = &pTVar1->nextInAEL;
      }
      *ppTVar3 = pTVar5;
      if (pTVar5 != (TEdge *)0x0) {
        pTVar5->prevInAEL = pTVar1;
      }
      e2->nextInAEL = (TEdge *)0x0;
      e2->prevInAEL = (TEdge *)0x0;
    }
  }
  else {
    if (e2->outIdx < 0) {
LAB_006e4005:
      this_00 = (clipperException *)__cxa_allocate_exception(0x28);
      clipperException::clipperException(this_00,"DoMaxima error");
LAB_006e3fef:
      __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
    }
    local_40.X = lVar6;
    local_40.Y = topY;
    IntersectEdges(this,e,e2,&local_40,ipNone);
  }
  return;
}

Assistant:

void Clipper::DoMaxima(TEdge *e, long64 topY)
{
  TEdge* eMaxPair = GetMaximaPair(e);
  long64 X = e->xtop;
  TEdge* eNext = e->nextInAEL;
  while( eNext != eMaxPair )
  {
    if (!eNext) throw clipperException("DoMaxima error");
    IntersectEdges( e, eNext, IntPoint(X, topY), ipBoth );
    eNext = eNext->nextInAEL;
  }
  if( e->outIdx < 0 && eMaxPair->outIdx < 0 )
  {
    DeleteFromAEL( e );
    DeleteFromAEL( eMaxPair );
  }
  else if( e->outIdx >= 0 && eMaxPair->outIdx >= 0 )
  {
    IntersectEdges( e, eMaxPair, IntPoint(X, topY), ipNone );
  }
  else throw clipperException("DoMaxima error");
}